

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O2

TEXTURE_FORMAT __thiscall
Diligent::VkFormatToTexFormatMapper::operator[](VkFormatToTexFormatMapper *this,VkFormat VkFmt)

{
  TEXTURE_FORMAT TVar1;
  const_iterator cVar2;
  key_type local_4;
  
  if ((int)VkFmt < 0xb9) {
    TVar1 = this->m_VkFmtToTexFmtMap[VkFmt];
  }
  else {
    cVar2 = std::
            _Hashtable<VkFormat,_std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>,_std::__detail::_Select1st,_std::equal_to<VkFormat>,_std::hash<VkFormat>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->m_VkFmtToTexFmtMapExt)._M_h,&local_4);
    if (cVar2.super__Node_iterator_base<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>,_true>.
        _M_cur == (__node_type *)0x0) {
      TVar1 = TEX_FORMAT_UNKNOWN;
    }
    else {
      TVar1 = *(TEXTURE_FORMAT *)
               ((long)cVar2.
                      super__Node_iterator_base<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>,_true>
                      ._M_cur + 0xc);
    }
  }
  return TVar1;
}

Assistant:

TEXTURE_FORMAT operator[](VkFormat VkFmt) const
    {
        if (VkFmt < VK_FORMAT_RANGE_SIZE)
        {
            return m_VkFmtToTexFmtMap[VkFmt];
        }
        else
        {
            auto it = m_VkFmtToTexFmtMapExt.find(VkFmt);
            return it != m_VkFmtToTexFmtMapExt.end() ? it->second : TEX_FORMAT_UNKNOWN;
        }
    }